

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  BaseType BVar2;
  pointer pcVar3;
  EnumDef *pEVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  size_type *psVar8;
  Type *type;
  char *pcVar9;
  string suffix;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  size_type *local_d0 [2];
  size_type local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  BVar1 = (field->value).type.base_type;
  pcVar3 = (field->super_Definition).name._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (field->super_Definition).name._M_string_length);
  LiteralSuffix_abi_cxx11_(&local_f0,(KotlinKMPGenerator *)&field->value,type);
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    goto LAB_001ef1dd;
  }
  if (BVar1 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (__return_storage_ptr__,
               (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
    if ((BVar1 == BASE_TYPE_DOUBLE) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        'f')) {
      std::__cxx11::string::pop_back();
    }
    goto LAB_001ef1dd;
  }
  if (BVar1 == BASE_TYPE_BOOL) {
    iVar5 = std::__cxx11::string::compare((char *)&(field->value).constant);
    pcVar9 = "true";
    if (iVar5 == 0) {
      pcVar9 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar9,pcVar9 + (ulong)(iVar5 == 0) + 4);
    goto LAB_001ef1dd;
  }
  pEVar4 = (field->value).type.enum_def;
  if (BVar2 - BASE_TYPE_UTYPE < 10 && pEVar4 != (EnumDef *)0x0) {
LAB_001ef2fa:
    std::operator+(&local_70,&(field->value).constant,&local_f0);
    WrapEnumValue(__return_storage_ptr__,this,&(field->value).type,&local_70);
    local_c0[0] = local_70.field_2._M_allocated_capacity;
    local_d0[0] = (size_type *)local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001ef1dd;
LAB_001ef349:
    operator_delete(local_d0[0],local_c0[0] + 1);
    goto LAB_001ef1dd;
  }
  if ((BVar2 != BASE_TYPE_VECTOR64) && (BVar2 != BASE_TYPE_VECTOR)) {
switchD_001ef369_caseD_2:
    std::operator+(__return_storage_ptr__,&(field->value).constant,&local_f0);
    goto LAB_001ef1dd;
  }
  uVar6 = (field->value).type.element - BASE_TYPE_UTYPE;
  if (uVar6 < 10 && pEVar4 != (EnumDef *)0x0) goto LAB_001ef2fa;
  switch(uVar6) {
  case 0:
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_d0,&this->namer_);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_d0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110.field_2._8_8_ = plVar7[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_110._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::operator+(&local_b0,&local_110,&(field->value).constant);
    std::operator+(&local_90,&local_b0,&local_f0);
    std::operator+(__return_storage_ptr__,&local_90,")");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_d0[0] == local_c0) goto LAB_001ef1dd;
    goto LAB_001ef349;
  case 1:
    iVar5 = std::__cxx11::string::compare((char *)&(field->value).constant);
    pcVar9 = "true";
    if (iVar5 == 0) {
      pcVar9 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar9,pcVar9 + (ulong)(iVar5 == 0) + 4);
    goto LAB_001ef1dd;
  default:
    goto switchD_001ef369_caseD_2;
  case 10:
    pcVar9 = "f";
    break;
  case 0xb:
    pcVar9 = ".toDouble()";
    break;
  case 0xc:
  case 0xe:
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    goto LAB_001ef1dd;
  }
  std::operator+(__return_storage_ptr__,&(field->value).constant,pcVar9);
LAB_001ef1dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field) const {
    auto &value = field.value;
    auto base_type = value.type.base_type;
    auto field_name = field.name;
    std::string suffix = LiteralSuffix(value.type);
    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    if (IsEnum(field.value.type) ||
        (IsVector(field.value.type) && IsEnum(field.value.type.VectorType()))) {
      return WrapEnumValue(field.value.type, value.constant + suffix);
    }

    if (IsVector(field.value.type) &&
        (field.value.type.VectorType().base_type == BASE_TYPE_UNION ||
         field.value.type.VectorType().base_type == BASE_TYPE_STRUCT ||
         field.value.type.VectorType().base_type == BASE_TYPE_STRING)) {
      return "null";
    }
    if (IsVector(field.value.type)) {
      switch (field.value.type.element) {
        case BASE_TYPE_UTYPE:
          return namer_.Type(*field.value.type.enum_def) + "(" +
                 value.constant + suffix + ")";
        case BASE_TYPE_UNION:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_STRING: return "null";
        case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";
        case BASE_TYPE_FLOAT: return value.constant + "f";
        case BASE_TYPE_DOUBLE: {
          return value.constant + ".toDouble()";
        }
        default: return value.constant + suffix;
      }
    }
    return value.constant + suffix;
  }